

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

uint64_t dup_const_func_sparc64(uint vece,uint64_t c)

{
  uint64_t c_local;
  uint64_t uStack_10;
  uint vece_local;
  
  switch(vece) {
  case 0:
    uStack_10 = (c & 0xff) * 0x101010101010101;
    break;
  case 1:
    uStack_10 = (c & 0xffff) * 0x1000100010001;
    break;
  case 2:
    uStack_10 = (c & 0xffffffff) * 0x100000001;
    break;
  case 3:
    uStack_10 = c;
    break;
  default:
    uStack_10 = 0;
  }
  return uStack_10;
}

Assistant:

uint64_t dup_const_func(unsigned vece, uint64_t c)
{
    switch (vece) {
    case MO_8:
        return 0x0101010101010101ull * (uint8_t)c;
    case MO_16:
        return 0x0001000100010001ull * (uint16_t)c;
    case MO_32:
        return 0x0000000100000001ull * (uint32_t)c;
    case MO_64:
        return c;
    default:
        // g_assert_not_reached();
        return 0;
    }
}